

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

Variable __thiscall
LiteScript::_Type_STRING::ONotEqual(_Type_STRING *this,Variable *obj1,Variable *obj2)

{
  String *pSVar1;
  bool bVar2;
  char32_t c;
  Object *pOVar3;
  Type *pTVar4;
  Variable *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  uint *puVar5;
  Variable VVar6;
  String local_48;
  
  pOVar3 = Variable::operator->(obj2);
  Memory::Create((Memory *)this,(Type *)pOVar3->memory);
  pOVar3 = Variable::operator->(in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar2 = Type::operator!=(pTVar4,(Type *)obj1);
  if (bVar2) {
    pOVar3 = Variable::operator->(in_RCX);
    pTVar4 = Object::GetType(pOVar3);
    bVar2 = Type::operator==(pTVar4,(Type *)_type_character);
    if (bVar2) {
      pOVar3 = Variable::operator->(obj2);
      pSVar1 = (String *)pOVar3->data;
      pOVar3 = Variable::operator->(in_RCX);
      c = Character::operator_cast_to_char32_t((Character *)pOVar3->data);
      String::String(&local_48,c);
      bVar2 = String::operator!=(pSVar1,&local_48);
      pOVar3 = Variable::operator->((Variable *)this);
      *(bool *)pOVar3->data = bVar2;
      puVar5 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_48.str._M_dataplus._M_p != &local_48.str.field_2) {
        operator_delete(local_48.str._M_dataplus._M_p);
        puVar5 = extraout_RDX_00;
      }
    }
    else {
      pOVar3 = Variable::operator->((Variable *)this);
      *(undefined1 *)pOVar3->data = 1;
      puVar5 = extraout_RDX_02;
    }
  }
  else {
    pOVar3 = Variable::operator->(obj2);
    pSVar1 = (String *)pOVar3->data;
    pOVar3 = Variable::operator->(in_RCX);
    bVar2 = String::operator!=(pSVar1,(String *)pOVar3->data);
    pOVar3 = Variable::operator->((Variable *)this);
    *(bool *)pOVar3->data = bVar2;
    puVar5 = extraout_RDX_01;
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_STRING::ONotEqual(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    Variable res = obj1->memory.Create(Type::BOOLEAN);
    if (obj2->GetType() != *this) {
        if (obj2->GetType() == _type_character)
            res->GetData<bool>() = (obj1->GetData<String>() != String((char32_t)obj2->GetData<Character>()));
        else
            res->GetData<bool>() = true;
    }
    else
        res->GetData<bool>() = (obj1->GetData<String>() != obj2->GetData<String>());
    return res;
}